

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O3

bool QPDF::validatePDFVersion(char **p,string *version)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = *p;
  if ((byte)(*pcVar2 - 0x30U) < 10) {
    do {
      *p = pcVar2 + 1;
      std::__cxx11::string::_M_replace_aux((ulong)version,version->_M_string_length,0,'\x01');
      pcVar2 = *p;
    } while ((byte)(*pcVar2 - 0x30U) < 10);
    if ((*pcVar2 == '.') && ((byte)(pcVar2[1] - 0x30U) < 10)) {
      *p = pcVar2 + 1;
      std::__cxx11::string::_M_replace_aux((ulong)version,version->_M_string_length,0,'\x01');
      pcVar2 = *p;
      cVar1 = *pcVar2;
      while ((byte)(cVar1 - 0x30U) < 10) {
        *p = pcVar2 + 1;
        std::__cxx11::string::_M_replace_aux((ulong)version,version->_M_string_length,0,'\x01');
        pcVar2 = *p;
        cVar1 = *pcVar2;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool
QPDF::validatePDFVersion(char const*& p, std::string& version)
{
    bool valid = util::is_digit(*p);
    if (valid) {
        while (util::is_digit(*p)) {
            version.append(1, *p++);
        }
        if ((*p == '.') && util::is_digit(*(p + 1))) {
            version.append(1, *p++);
            while (util::is_digit(*p)) {
                version.append(1, *p++);
            }
        } else {
            valid = false;
        }
    }
    return valid;
}